

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O0

int registerlocalvar(LexState *ls,TString *varname)

{
  short sVar1;
  FuncState *pFVar2;
  Proto *o;
  LocVar *pLVar3;
  int local_2c;
  int oldsize;
  Proto *f;
  FuncState *fs;
  TString *varname_local;
  LexState *ls_local;
  
  pFVar2 = ls->fs;
  o = pFVar2->f;
  local_2c = o->sizelocvars;
  if (o->sizelocvars < pFVar2->nlocvars + 1) {
    pLVar3 = (LocVar *)luaM_growaux_(ls->L,o->locvars,&o->sizelocvars,0x10,0x7fff,"local variables")
    ;
    o->locvars = pLVar3;
  }
  while (local_2c < o->sizelocvars) {
    o->locvars[local_2c].varname = (TString *)0x0;
    local_2c = local_2c + 1;
  }
  o->locvars[pFVar2->nlocvars].varname = varname;
  if (((o->marked & 4) != 0) && ((varname->marked & 3) != 0)) {
    luaC_barrier_(ls->L,(GCObject *)o,(GCObject *)varname);
  }
  sVar1 = pFVar2->nlocvars;
  pFVar2->nlocvars = sVar1 + 1;
  return (int)sVar1;
}

Assistant:

static int registerlocalvar (LexState *ls, TString *varname) {
  FuncState *fs = ls->fs;
  Proto *f = fs->f;
  int oldsize = f->sizelocvars;
  luaM_growvector(ls->L, f->locvars, fs->nlocvars, f->sizelocvars,
                  LocVar, SHRT_MAX, "local variables");
  while (oldsize < f->sizelocvars)
    f->locvars[oldsize++].varname = NULL;
  f->locvars[fs->nlocvars].varname = varname;
  luaC_objbarrier(ls->L, f, varname);
  return fs->nlocvars++;
}